

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

Var __thiscall
Js::InterpreterStackFrame::OP_ProfiledStrictLdThis
          (InterpreterStackFrame *this,Var thisVar,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  DynamicProfileInfo *this_00;
  undefined4 *puVar4;
  RecyclableObject *this_01;
  ThisType thisType;
  Type TVar5;
  
  this_00 = FunctionBody::GetDynamicProfileInfo(*(FunctionBody **)(this + 0x88));
  if (thisVar == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_00a54ab1;
    *puVar4 = 0;
  }
  if (((ulong)thisVar & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)thisVar & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00a54ab1;
    *puVar4 = 0;
  }
  TVar5 = TypeIds_FirstNumberType;
  if ((((ulong)thisVar & 0xffff000000000000) != 0x1000000000000) &&
     (TVar5 = TypeIds_Number, (ulong)thisVar >> 0x32 == 0)) {
    this_01 = UnsafeVarTo<Js::RecyclableObject>(thisVar);
    if (this_01 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_00a54ab1;
      *puVar4 = 0;
    }
    TVar5 = ((this_01->type).ptr)->typeId;
    if (0x57 < (int)TVar5) {
      BVar3 = RecyclableObject::IsExternal(this_01);
      if (BVar3 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar2) {
LAB_00a54ab1:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
    }
  }
  if (TVar5 == TypeIds_ActivationObject) {
    thisVar = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
              super_JavascriptLibraryBase).undefinedValue.ptr;
    thisType = ThisType_Mapped;
  }
  else {
    thisType = ThisType_Simple;
  }
  DynamicProfileInfo::RecordThisInfo(this_00,thisVar,thisType);
  return (RecyclableObject *)thisVar;
}

Assistant:

Var InterpreterStackFrame::OP_ProfiledStrictLdThis(Var thisVar, ScriptContext* scriptContext)
    {
        FunctionBody * functionBody = this->m_functionBody;
        DynamicProfileInfo * dynamicProfileInfo = functionBody->GetDynamicProfileInfo();
        TypeId typeId = JavascriptOperators::GetTypeId(thisVar);

        if (typeId == TypeIds_ActivationObject)
        {
            thisVar = scriptContext->GetLibrary()->GetUndefined();
            dynamicProfileInfo->RecordThisInfo(thisVar, ThisType_Mapped);
            return thisVar;
        }

        dynamicProfileInfo->RecordThisInfo(thisVar, ThisType_Simple);
        return thisVar;
    }